

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O0

void ikcp_parse_una(ikcpcb *kcp,IUINT32 una)

{
  IQUEUEHEAD *pIVar1;
  IKCPSEG *seg;
  IQUEUEHEAD *next;
  IQUEUEHEAD *p;
  IUINT32 una_local;
  ikcpcb *kcp_local;
  
  next = (kcp->snd_buf).next;
  while ((next != &kcp->snd_buf &&
         (pIVar1 = next->next, 0 < (int)(una - *(int *)((long)&next[2].next + 4))))) {
    next->next->prev = next->prev;
    next->prev->next = next->next;
    next->next = (IQUEUEHEAD *)0x0;
    next->prev = (IQUEUEHEAD *)0x0;
    ikcp_segment_delete(kcp,(IKCPSEG *)next);
    kcp->nsnd_buf = kcp->nsnd_buf - 1;
    next = pIVar1;
  }
  return;
}

Assistant:

static void ikcp_parse_una(ikcpcb *kcp, IUINT32 una)
{
	struct IQUEUEHEAD *p, *next;
	for (p = kcp->snd_buf.next; p != &kcp->snd_buf; p = next) {
		IKCPSEG *seg = iqueue_entry(p, IKCPSEG, node);
		next = p->next;
		if (_itimediff(una, seg->sn) > 0) {
			iqueue_del(p);
			ikcp_segment_delete(kcp, seg);
			kcp->nsnd_buf--;
		}	else {
			break;
		}
	}
}